

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

Node * __thiscall anon_unknown.dwarf_18d51b::Db::parseName(Db *this,NameState *State)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  char *pcVar5;
  Node **ppNVar6;
  FunctionRefQual FVar7;
  bool bVar8;
  Qualifiers QVar9;
  char *pcVar10;
  NameType *pNVar11;
  Node *pNVar12;
  NameWithTemplateArgs *pNVar13;
  Node *pNVar14;
  byte *pbVar15;
  CtorDtorName *Comp;
  LocalName *pLVar16;
  byte *pbVar17;
  byte *pbVar18;
  NameState *State_00;
  StringView S;
  StringView S_00;
  StringView S_01;
  Node *TA_1;
  Node *SoFar;
  Node *TA;
  Node *N;
  Db *local_50;
  NameState **local_48;
  NameState *local_40;
  BumpPointerAllocator *local_38;
  
  pcVar10 = this->First;
  pcVar5 = this->Last;
  if ((pcVar10 != pcVar5) && (*pcVar10 == 'L')) {
    pcVar10 = pcVar10 + 1;
    this->First = pcVar10;
  }
  if (pcVar5 != pcVar10) {
    cVar2 = *pcVar10;
    if (cVar2 == 'Z') {
      this->First = pcVar10 + 1;
      pNVar14 = parseEncoding(this);
      if (pNVar14 == (Node *)0x0) {
        return (Node *)0x0;
      }
      pcVar10 = this->First;
      pcVar5 = this->Last;
      if (pcVar10 == pcVar5) {
        return (Node *)0x0;
      }
      if (*pcVar10 != 'E') {
        return (Node *)0x0;
      }
      pcVar1 = pcVar10 + 1;
      this->First = pcVar1;
      N = pNVar14;
      if (pcVar1 != pcVar5) {
        if (*pcVar1 == 's') {
          this->First = pcVar10 + 2;
          pcVar10 = parse_discriminator(pcVar10 + 2,pcVar5);
          this->First = pcVar10;
          pNVar11 = (anonymous_namespace)::Db::
                    make<(anonymous_namespace)::NameType,char_const(&)[15]>
                              ((Db *)this,(char (*) [15])"string literal");
          pNVar12 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
          pNVar12->K = KLocalName;
          pNVar12->RHSComponentCache = No;
          pNVar12->ArrayCache = No;
          pNVar12->FunctionCache = No;
          pNVar12->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00185528;
          pNVar12[1]._vptr_Node = (_func_int **)pNVar14;
          *(NameType **)&pNVar12[1].K = pNVar11;
          return pNVar12;
        }
        if (*pcVar1 == 'd') {
          this->First = pcVar10 + 2;
          parseNumber(this,true);
          pcVar10 = this->First;
          if (pcVar10 == this->Last) {
            return (Node *)0x0;
          }
          if (*pcVar10 != '_') {
            return (Node *)0x0;
          }
          this->First = pcVar10 + 1;
          TA_1 = parseName(this,State);
          if (TA_1 == (Node *)0x0) {
            return (Node *)0x0;
          }
          goto LAB_0014a1c4;
        }
      }
      TA_1 = parseName(this,State);
      if (TA_1 == (Node *)0x0) {
        return (Node *)0x0;
      }
      pcVar10 = parse_discriminator(this->First,this->Last);
      this->First = pcVar10;
LAB_0014a1c4:
      pLVar16 = (anonymous_namespace)::Db::
                make<(anonymous_namespace)::LocalName,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
                          ((Db *)this,&N,&TA_1);
      return &pLVar16->super_Node;
    }
    if (cVar2 == 'S') {
      if (((ulong)((long)pcVar5 - (long)pcVar10) < 2) || (pcVar10[1] != 't')) {
        N = parseSubstitution(this);
        if (N == (Node *)0x0) {
          return (Node *)0x0;
        }
        if (this->Last == this->First) {
          return (Node *)0x0;
        }
        if (*this->First != 'I') {
          return (Node *)0x0;
        }
        goto LAB_00149d20;
      }
    }
    else if (cVar2 == 'N') {
      this->First = pcVar10 + 1;
      TA_1 = (Node *)State;
      QVar9 = parseCVQualifiers(this);
      if (State != (NameState *)0x0) {
        State->CVQualifiers = QVar9;
      }
      pcVar10 = this->First;
      if (pcVar10 == this->Last) {
LAB_00149da1:
        if (State != (NameState *)0x0) {
          FVar7 = FrefQualNone;
          goto LAB_00149da8;
        }
      }
      else {
        if (*pcVar10 == 'O') {
          this->First = pcVar10 + 1;
          FVar7 = FrefQualRValue;
        }
        else {
          if (*pcVar10 != 'R') goto LAB_00149da1;
          this->First = pcVar10 + 1;
          FVar7 = FrefQualLValue;
        }
        if (State != (NameState *)0x0) {
LAB_00149da8:
          State->ReferenceQualifier = FVar7;
        }
      }
      N = (Node *)&SoFar;
      SoFar = (Node *)0x0;
      local_48 = (NameState **)&TA_1;
      S_01.Last = "";
      S_01.First = "St";
      local_50 = this;
      bVar8 = consumeIf(this,S_01);
      if (bVar8) {
        SoFar = &(anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[4]>
                           ((Db *)this,(char (*) [4])"std")->super_Node;
      }
      local_38 = &this->ASTAllocator;
LAB_00149e19:
      pbVar17 = (byte *)this->First;
      pbVar15 = (byte *)this->Last;
      if (pbVar17 != pbVar15) {
        if (*pbVar17 == 0x45) {
          this->First = (char *)(pbVar17 + 1);
          if (SoFar == (Node *)0x0) {
            return (Node *)0x0;
          }
          ppNVar6 = (this->Subs).Last;
          if ((this->Subs).First == ppNVar6) {
            return (Node *)0x0;
          }
          (this->Subs).Last = ppNVar6 + -1;
          return SoFar;
        }
        if (*pbVar17 == 0x4c) {
          pbVar17 = pbVar17 + 1;
          this->First = (char *)pbVar17;
        }
      }
      if (pbVar17 == pbVar15) {
LAB_00149f62:
        pNVar14 = parseUnqualifiedName(this,(NameState *)TA_1);
LAB_00149f6f:
        if (pNVar14 == (Node *)0x0) {
          return (Node *)0x0;
        }
        parseNestedName::anon_class_24_3_ca1439d7::operator()
                  ((anon_class_24_3_ca1439d7 *)&N,pNVar14);
LAB_00149f83:
        PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Subs,&SoFar);
        goto LAB_00149e19;
      }
      if (*pbVar17 == 0x4d) {
        this->First = (char *)(pbVar17 + 1);
        if (SoFar == (Node *)0x0) {
          return (Node *)0x0;
        }
        goto LAB_00149e19;
      }
      bVar3 = *pbVar17;
      if (bVar3 != 0x43) {
        if (bVar3 != 0x44) {
          if (bVar3 == 0x49) {
            TA = parseTemplateArgs(this,TA_1 != (Node *)0x0);
            if (TA == (Node *)0x0) {
              return (Node *)0x0;
            }
            if (SoFar == (Node *)0x0) {
              return (Node *)0x0;
            }
            SoFar = &(anonymous_namespace)::Db::
                     make<(anonymous_namespace)::NameWithTemplateArgs,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
                               ((Db *)this,&SoFar,&TA)->super_Node;
            if (TA_1 != (Node *)0x0) {
              *(undefined1 *)((long)&TA_1->_vptr_Node + 1) = 1;
            }
            goto LAB_00149f83;
          }
          if (bVar3 == 0x53) {
            if ((1 < (ulong)((long)pbVar15 - (long)pbVar17)) && (pbVar17[1] == 0x74))
            goto LAB_00149f62;
            pNVar14 = parseSubstitution(this);
            if (pNVar14 == (Node *)0x0) {
              return (Node *)0x0;
            }
            TA = pNVar14;
            parseNestedName::anon_class_24_3_ca1439d7::operator()
                      ((anon_class_24_3_ca1439d7 *)&N,pNVar14);
            if (SoFar != pNVar14) {
              PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Subs,&TA);
            }
            goto LAB_00149e19;
          }
          if (bVar3 == 0x54) {
            pNVar14 = parseTemplateParam(this);
            goto LAB_00149f6f;
          }
          goto LAB_00149f62;
        }
        if (1 < (ulong)((long)pbVar15 - (long)pbVar17)) {
          if ((pbVar17[1] | 0x20) == 0x74) {
            pNVar14 = parseDecltype(this);
            goto LAB_00149f6f;
          }
          if (pbVar17[1] == 0x43) goto LAB_00149f62;
        }
      }
      if (SoFar == (Node *)0x0) {
        return (Node *)0x0;
      }
      State_00 = (NameState *)TA_1;
      if ((SoFar->K == KSpecialSubstitution) && (iVar4 = *(int *)&SoFar->field_0xc, iVar4 - 2U < 4))
      {
        local_40 = (NameState *)TA_1;
        SoFar = (Node *)BumpPointerAllocator::allocate(local_38,0x10);
        SoFar->K = KExpandedSpecialSubstitution;
        SoFar->RHSComponentCache = No;
        SoFar->ArrayCache = No;
        SoFar->FunctionCache = No;
        SoFar->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00185318;
        *(int *)&SoFar->field_0xc = iVar4;
        pbVar17 = (byte *)this->First;
        pbVar15 = (byte *)this->Last;
        State_00 = local_40;
      }
      if (pbVar17 == pbVar15) {
        return (Node *)0x0;
      }
      if (*pbVar17 == 0x43) {
        pbVar18 = pbVar17 + 1;
        this->First = (char *)pbVar18;
        if (pbVar18 == pbVar15) {
          bVar8 = false;
        }
        else if (*pbVar18 == 0x49) {
          pbVar18 = pbVar17 + 2;
          this->First = (char *)pbVar18;
          bVar8 = true;
        }
        else {
          bVar8 = false;
        }
        if (pbVar15 == pbVar18) {
          return (Node *)0x0;
        }
        if (0x35 < (ulong)*pbVar18) {
          return (Node *)0x0;
        }
        if ((0x2e000000000000U >> ((ulong)*pbVar18 & 0x3f) & 1) == 0) {
          return (Node *)0x0;
        }
        this->First = (char *)(pbVar18 + 1);
        if (State_00 != (NameState *)0x0) {
          State_00->CtorDtorConversion = true;
        }
        if ((bVar8) && (pNVar14 = parseName(this,State_00), pNVar14 == (Node *)0x0)) {
          return (Node *)0x0;
        }
        TA = (Node *)((ulong)TA & 0xffffffffffffff00);
      }
      else {
        if ((ulong)((long)pbVar15 - (long)pbVar17) < 2) {
          return (Node *)0x0;
        }
        if (*pbVar17 != 0x44) {
          return (Node *)0x0;
        }
        if (0x35 < (ulong)pbVar17[1]) {
          return (Node *)0x0;
        }
        if ((0x27000000000000U >> ((ulong)pbVar17[1] & 0x3f) & 1) == 0) {
          return (Node *)0x0;
        }
        this->First = (char *)(pbVar17 + 2);
        if (State_00 != (NameState *)0x0) {
          State_00->CtorDtorConversion = true;
        }
        TA = (Node *)CONCAT71(TA._1_7_,1);
      }
      Comp = (anonymous_namespace)::Db::
             make<(anonymous_namespace)::CtorDtorName,(anonymous_namespace)::Node*&,bool>
                       ((Db *)this,&SoFar,(bool *)&TA);
      parseNestedName::anon_class_24_3_ca1439d7::operator()
                ((anon_class_24_3_ca1439d7 *)&N,&Comp->super_Node);
      SoFar = parseAbiTags(this,SoFar);
      if (SoFar == (Node *)0x0) {
        return (Node *)0x0;
      }
      goto LAB_00149f83;
    }
  }
  S.Last = "";
  S.First = "StL";
  bVar8 = consumeIf(this,S);
  if ((bVar8) || (S_00.Last = "", S_00.First = "St", bVar8 = consumeIf(this,S_00), bVar8)) {
    pNVar14 = parseUnqualifiedName(this,State);
    if (pNVar14 == (Node *)0x0) {
      return (Node *)0x0;
    }
    N = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x18);
    N->K = KStdQualifiedName;
    N->RHSComponentCache = No;
    N->ArrayCache = No;
    N->FunctionCache = No;
    N->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001856e0;
    N[1]._vptr_Node = (_func_int **)pNVar14;
  }
  else {
    N = parseUnqualifiedName(this,State);
    if (N == (Node *)0x0) {
      return (Node *)0x0;
    }
  }
  if (this->Last == this->First) {
    return N;
  }
  if (*this->First != 'I') {
    return N;
  }
  PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Subs,&N);
LAB_00149d20:
  TA_1 = parseTemplateArgs(this,State != (NameState *)0x0);
  if (TA_1 == (Node *)0x0) {
    return (Node *)0x0;
  }
  if (State != (NameState *)0x0) {
    State->EndsWithTemplateArgs = true;
  }
  pNVar13 = (anonymous_namespace)::Db::
            make<(anonymous_namespace)::NameWithTemplateArgs,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
                      ((Db *)this,&N,&TA_1);
  return &pNVar13->super_Node;
}

Assistant:

Node *Db::parseName(NameState *State) {
  consumeIf('L'); // extension

  if (look() == 'N')
    return parseNestedName(State);
  if (look() == 'Z')
    return parseLocalName(State);

  //        ::= <unscoped-template-name> <template-args>
  if (look() == 'S' && look(1) != 't') {
    Node *S = parseSubstitution();
    if (S == nullptr)
      return nullptr;
    if (look() != 'I')
      return nullptr;
    Node *TA = parseTemplateArgs(State != nullptr);
    if (TA == nullptr)
      return nullptr;
    if (State) State->EndsWithTemplateArgs = true;
    return make<NameWithTemplateArgs>(S, TA);
  }

  Node *N = parseUnscopedName(State);
  if (N == nullptr)
    return nullptr;
  //        ::= <unscoped-template-name> <template-args>
  if (look() == 'I') {
    Subs.push_back(N);
    Node *TA = parseTemplateArgs(State != nullptr);
    if (TA == nullptr)
      return nullptr;
    if (State) State->EndsWithTemplateArgs = true;
    return make<NameWithTemplateArgs>(N, TA);
  }
  //        ::= <unscoped-name>
  return N;
}